

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O1

void __thiscall
QGraphicsLinearLayout::setStretchFactor
          (QGraphicsLinearLayout *this,QGraphicsLayoutItem *item,int stretch)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  int iVar2;
  QGraphicsLinearLayoutPrivate *d;
  
  if (item == (QGraphicsLayoutItem *)0x0) {
    setStretchFactor();
  }
  else {
    pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
    iVar2 = QGraphicsGridLayoutEngine::stretchFactor
                      ((QGraphicsGridLayoutEngine *)(pQVar1[1].cachedSizeHints + 1),item,
                       *(Orientation *)((long)&pQVar1[1].cachedSizeHints[0].wd + 4));
    if (iVar2 != stretch) {
      QGraphicsGridLayoutEngine::setStretchFactor
                ((QGraphicsGridLayoutEngine *)(pQVar1[1].cachedSizeHints + 1),item,stretch,
                 *(Orientation *)((long)&pQVar1[1].cachedSizeHints[0].wd + 4));
      (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsLinearLayout::setStretchFactor(QGraphicsLayoutItem *item, int stretch)
{
    Q_D(QGraphicsLinearLayout);
    if (!item) {
        qWarning("QGraphicsLinearLayout::setStretchFactor: cannot assign"
                 " a stretch factor to a null item");
        return;
    }
    if (stretchFactor(item) == stretch)
        return;
    d->engine.setStretchFactor(item, stretch, d->orientation);
    invalidate();
}